

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

char * err_reason_error_string(uint32_t packed_error,int symbol)

{
  char *pcVar1;
  LIBRARY_NAME *pLVar2;
  uint *puVar3;
  char *pcVar4;
  uint __errnum;
  undefined1 local_4 [4];
  
  __errnum = packed_error & 0xfff;
  if (packed_error >> 0x18 == 2) {
    if (__errnum < 0x7f && symbol == 0) {
      pcVar1 = strerror(__errnum);
      return pcVar1;
    }
  }
  else {
    if (__errnum < 0x23) {
      pLVar2 = (LIBRARY_NAME *)&kLibraryNames[__errnum].reason_symbol;
      if (symbol == 0) {
        pLVar2 = kLibraryNames + __errnum;
      }
      return pLVar2->str;
    }
    if (__errnum < 100) {
      switch(__errnum) {
      case 0x41:
        pcVar4 = "malloc failure";
        pcVar1 = "MALLOC_FAILURE";
        break;
      case 0x42:
        pcVar4 = "function should not have been called";
        pcVar1 = "SHOULD_NOT_HAVE_BEEN_CALLED";
        break;
      case 0x43:
        pcVar4 = "passed a null parameter";
        pcVar1 = "PASSED_NULL_PARAMETER";
        break;
      case 0x44:
        pcVar4 = "internal error";
        pcVar1 = "INTERNAL_ERROR";
        break;
      case 0x45:
        pcVar4 = "overflow";
        pcVar1 = "OVERFLOW";
        break;
      default:
        goto switchD_00391e92_default;
      }
      if (symbol == 0) {
        pcVar1 = pcVar4;
      }
      return pcVar1;
    }
    if (__errnum < 0x800 && packed_error < 0x40000000) {
      puVar3 = (uint *)bsearch(local_4,kOpenSSLReasonValues,0x2ff,4,err_string_cmp);
      if (puVar3 == (uint *)0x0) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = "ASN1_LENGTH_MISMATCH" + (*puVar3 & 0x7fff);
      }
      return pcVar1;
    }
  }
switchD_00391e92_default:
  return (char *)0x0;
}

Assistant:

static const char *err_reason_error_string(uint32_t packed_error, int symbol) {
  const uint32_t lib = ERR_GET_LIB(packed_error);
  const uint32_t reason = ERR_GET_REASON(packed_error);

  if (lib == ERR_LIB_SYS) {
    if (!symbol && reason < 127) {
      return strerror(reason);
    }
    return NULL;
  }

  if (reason < ERR_NUM_LIBS) {
    return symbol ? kLibraryNames[reason].reason_symbol
                  : kLibraryNames[reason].str;
  }

  if (reason < 100) {
    // TODO(davidben): All our other reason strings match the symbol name. Only
    // the common ones differ. Should we just consistently return the symbol
    // name?
    switch (reason) {
      case ERR_R_MALLOC_FAILURE:
        return symbol ? "MALLOC_FAILURE" : "malloc failure";
      case ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED:
        return symbol ? "SHOULD_NOT_HAVE_BEEN_CALLED"
                      : "function should not have been called";
      case ERR_R_PASSED_NULL_PARAMETER:
        return symbol ? "PASSED_NULL_PARAMETER" : "passed a null parameter";
      case ERR_R_INTERNAL_ERROR:
        return symbol ? "INTERNAL_ERROR" : "internal error";
      case ERR_R_OVERFLOW:
        return symbol ? "OVERFLOW" : "overflow";
      default:
        return NULL;
    }
  }

  // Unlike OpenSSL, BoringSSL's reason strings already match symbol name, so we
  // do not need to check |symbol|.
  return err_string_lookup(lib, reason, kOpenSSLReasonValues,
                           kOpenSSLReasonValuesLen, kOpenSSLReasonStringData);
}